

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O2

int __thiscall ncnn::Bias::forward_inplace(Bias *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  void *pvVar2;
  int i;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  Mat local_68;
  
  uVar5 = bottom_top_blob->h * bottom_top_blob->w;
  uVar7 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  uVar4 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar4 = uVar7;
  }
  for (; uVar7 != uVar4; uVar7 = uVar7 + 1) {
    Mat::channel(&local_68,bottom_top_blob,(int)uVar7);
    pvVar2 = local_68.data;
    Mat::~Mat(&local_68);
    fVar1 = *(float *)((long)(this->bias_data).data + uVar7 * 4);
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      *(float *)((long)pvVar2 + uVar3 * 4) = *(float *)((long)pvVar2 + uVar3 * 4) + fVar1;
    }
  }
  return 0;
}

Assistant:

int Bias::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_data[q];

        for (int i=0; i<size; i++)
        {
            ptr[i] += bias;
        }
    }

    return 0;
}